

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2UDiv<unsigned_int>
          (OptimizeInstructions *this,Binary *binary,uint c)

{
  Const *pCVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_30;
  undefined8 local_20;
  
  local_30.i32 = Bits::countTrailingZeroes(c);
  binary->op = ShrUInt32;
  local_20 = 2;
  pCVar1 = Expression::cast<wasm::Const>(binary->right);
  Literal::operator=(&pCVar1->value,(Literal *)&local_30.func);
  Literal::~Literal((Literal *)&local_30.func);
  return (Expression *)binary;
}

Assistant:

Expression* optimizePowerOf2UDiv(Binary* binary, T c) {
    static_assert(std::is_same<T, uint32_t>::value ||
                    std::is_same<T, uint64_t>::value,
                  "type mismatch");
    auto shifts = Bits::countTrailingZeroes(c);
    binary->op = std::is_same<T, uint32_t>::value ? ShrUInt32 : ShrUInt64;
    binary->right->cast<Const>()->value = Literal(static_cast<T>(shifts));
    return binary;
  }